

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runsuite.c
# Opt level: O0

void installResources(xmlNodePtr tst,xmlChar *base)

{
  long lVar1;
  xmlNodePtr pxVar2;
  xmlChar *path;
  undefined8 uVar3;
  char *content_00;
  xmlChar *name_00;
  xmlChar *res;
  xmlChar *content;
  xmlChar *name;
  xmlBufferPtr buf;
  xmlNodePtr test;
  xmlChar *base_local;
  xmlNodePtr tst_local;
  
  lVar1 = xmlBufferCreate();
  if (lVar1 == 0) {
    fprintf(_stderr,"out of memory !\n");
    fatalError();
  }
  xmlBufferSetAllocationScheme(lVar1,0);
  xmlNodeDump(lVar1,tst->doc,tst,0);
  for (base_local = (xmlChar *)tst; base_local != (xmlChar *)0x0;
      base_local = (xmlChar *)getNext((xmlNodePtr)base_local,"following-sibling::resource[1]")) {
    pxVar2 = getNext((xmlNodePtr)base_local,"./*");
    if (pxVar2 != (xmlNodePtr)0x0) {
      xmlBufferEmpty(lVar1);
      xmlNodeDump(lVar1,pxVar2->doc,pxVar2,0);
      path = getString((xmlNodePtr)base_local,"string(@name)");
      uVar3 = xmlBufferContent(lVar1);
      content_00 = (char *)xmlStrdup(uVar3);
      if ((path == (xmlChar *)0x0) || (content_00 == (char *)0x0)) {
        if (path != (xmlChar *)0x0) {
          (*_xmlFree)(path);
        }
        if (content_00 != (char *)0x0) {
          (*_xmlFree)(content_00);
        }
      }
      else {
        name_00 = composeDir(base,path);
        (*_xmlFree)(path);
        addEntity((char *)name_00,content_00);
      }
    }
  }
  if (lVar1 != 0) {
    xmlBufferFree(lVar1);
  }
  return;
}

Assistant:

static void
installResources(xmlNodePtr tst, const xmlChar *base) {
    xmlNodePtr test;
    xmlBufferPtr buf;
    xmlChar *name, *content, *res;

    buf = xmlBufferCreate();
    if (buf == NULL) {
        fprintf(stderr, "out of memory !\n");
	fatalError();
    }
    xmlBufferSetAllocationScheme(buf, XML_BUFFER_ALLOC_DOUBLEIT);
    xmlNodeDump(buf, tst->doc, tst, 0, 0);

    while (tst != NULL) {
	test = getNext(tst, "./*");
	if (test != NULL) {
	    xmlBufferEmpty(buf);
	    xmlNodeDump(buf, test->doc, test, 0, 0);
	    name = getString(tst, "string(@name)");
	    content = xmlStrdup(xmlBufferContent(buf));
	    if ((name != NULL) && (content != NULL)) {
	        res = composeDir(base, name);
		xmlFree(name);
	        addEntity((char *) res, (char *) content);
	    } else {
	        if (name != NULL) xmlFree(name);
	        if (content != NULL) xmlFree(content);
	    }
	}
	tst = getNext(tst, "following-sibling::resource[1]");
    }
    if (buf != NULL)
	xmlBufferFree(buf);
}